

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PresolveComponent.cpp
# Opt level: O0

void __thiscall PresolveComponent::negateReducedLpColDuals(PresolveComponent *this)

{
  value_type vVar1;
  reference pvVar2;
  long in_RDI;
  HighsInt col;
  undefined4 local_c;
  
  for (local_c = 0; local_c < *(int *)(in_RDI + 0x48); local_c = local_c + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4e0),(long)local_c);
    vVar1 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4e0),(long)local_c);
    *pvVar2 = -vVar1;
  }
  return;
}

Assistant:

void PresolveComponent::negateReducedLpColDuals() {
  for (HighsInt col = 0; col < data_.reduced_lp_.num_col_; col++)
    data_.recovered_solution_.col_dual[col] =
        -data_.recovered_solution_.col_dual[col];
  return;
}